

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

ptls_t * new_instance(ptls_context_t *ctx,int is_server)

{
  byte bVar1;
  st_ptls_update_open_count_t *psVar2;
  ptls_t *ppVar3;
  byte bVar4;
  
  if (ctx->get_time != (ptls_get_time_t *)0x0) {
    ppVar3 = (ptls_t *)malloc(0x200);
    if (ppVar3 == (ptls_t *)0x0) {
      ppVar3 = (ptls_t *)0x0;
    }
    else {
      psVar2 = ctx->update_open_count;
      if (psVar2 != (st_ptls_update_open_count_t *)0x0) {
        (*psVar2->cb)(psVar2,1);
      }
      memset(&ppVar3->state,0,0x1f8);
      ppVar3->ctx = ctx;
      bVar1 = ppVar3->field_0x160;
      bVar4 = (byte)is_server & 1;
      ppVar3->field_0x160 = bVar1 & 0xfe | bVar4;
      ppVar3->field_0x160 = bVar1 & 0xda | bVar4 | ctx->field_0x70 & 4;
    }
    return ppVar3;
  }
  __assert_fail("ctx->get_time != NULL && \"please set ctx->get_time to `&ptls_get_time`; see #92\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x10ea,"ptls_t *new_instance(ptls_context_t *, int)");
}

Assistant:

static ptls_t *new_instance(ptls_context_t *ctx, int is_server)
{
    ptls_t *tls;

    assert(ctx->get_time != NULL && "please set ctx->get_time to `&ptls_get_time`; see #92");

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    update_open_count(ctx, 1);
    *tls = (ptls_t){ctx};
    tls->is_server = is_server;
    tls->send_change_cipher_spec = ctx->send_change_cipher_spec;
    tls->skip_tracing = ptls_default_skip_tracing;
    return tls;
}